

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StepFileImporter.cpp
# Opt level: O2

void __thiscall
Assimp::StepFile::StepFileImporter::InternReadFile
          (StepFileImporter *this,string *file,aiScene *pScene,IOSystem *pIOHandler)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  __uniq_ptr_data<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>,_true,_true> _Var3;
  DeadlyImportError *this_00;
  shared_ptr<Assimp::IOStream> fileStream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  __shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2> local_58;
  unique_ptr<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_> db;
  DeadlyImportError local_28;
  
  iVar2 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(file->_M_dataplus)._M_p,mode_abi_cxx11_);
  std::__shared_ptr<Assimp::IOStream,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Assimp::IOStream,void>
            ((__shared_ptr<Assimp::IOStream,(__gnu_cxx::_Lock_policy)2> *)&fileStream,
             (IOStream *)CONCAT44(extraout_var,iVar2));
  if (fileStream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&db,
                   "Failed to open file ",file);
    std::operator+(&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&db,".");
    DeadlyImportError::DeadlyImportError(this_00,&local_78);
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_58,&fileStream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>)
  ;
  _Var3.super___uniq_ptr_impl<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::STEP::DB_*,_std::default_delete<Assimp::STEP::DB>_>.
  super__Head_base<0UL,_Assimp::STEP::DB_*,_false>._M_head_impl =
       (__uniq_ptr_impl<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_>)
       STEP::ReadFileHeader((shared_ptr<Assimp::IOStream> *)&local_58);
  db._M_t.super___uniq_ptr_impl<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::STEP::DB_*,_std::default_delete<Assimp::STEP::DB>_>.
  super__Head_base<0UL,_Assimp::STEP::DB_*,_false>._M_head_impl =
       (__uniq_ptr_data<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>,_true,_true>)
       (__uniq_ptr_data<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>,_true,_true>)
       _Var3.super___uniq_ptr_impl<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_>._M_t.
       super__Tuple_impl<0UL,_Assimp::STEP::DB_*,_std::default_delete<Assimp::STEP::DB>_>.
       super__Head_base<0UL,_Assimp::STEP::DB_*,_false>._M_head_impl;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  if (*(size_type *)
       ((long)_Var3.super___uniq_ptr_impl<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_>.
              _M_t.
              super__Tuple_impl<0UL,_Assimp::STEP::DB_*,_std::default_delete<Assimp::STEP::DB>_>.
              super__Head_base<0UL,_Assimp::STEP::DB_*,_false>._M_head_impl + 0x48) != 0) {
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)_Var3.
                                   super___uniq_ptr_impl<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Assimp::STEP::DB_*,_std::default_delete<Assimp::STEP::DB>_>
                                   .super__Head_base<0UL,_Assimp::STEP::DB_*,_false>._M_head_impl +
                            0x40),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)StepFileSchema_abi_cxx11_);
    if (!bVar1) goto LAB_005617a2;
  }
  std::operator+(&local_78,"Unrecognized file schema: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)_Var3.
                        super___uniq_ptr_impl<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Assimp::STEP::DB_*,_std::default_delete<Assimp::STEP::DB>_>
                        .super__Head_base<0UL,_Assimp::STEP::DB_*,_false>._M_head_impl + 0x40));
  DeadlyImportError::DeadlyImportError(&local_28,&local_78);
  std::runtime_error::~runtime_error(&local_28.super_runtime_error);
  std::__cxx11::string::~string((string *)&local_78);
LAB_005617a2:
  std::unique_ptr<Assimp::STEP::DB,_std::default_delete<Assimp::STEP::DB>_>::~unique_ptr(&db);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&fileStream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void StepFileImporter::InternReadFile(const std::string &file, aiScene* pScene, IOSystem* pIOHandler) {
    // Read file into memory
    std::shared_ptr<IOStream> fileStream(pIOHandler->Open(file, mode));
    if (!fileStream.get()) {
        throw DeadlyImportError("Failed to open file " + file + ".");
    }

    std::unique_ptr<STEP::DB> db(STEP::ReadFileHeader(fileStream));
    const STEP::HeaderInfo& head = static_cast<const STEP::DB&>(*db).GetHeader();
    if (!head.fileSchema.size() || head.fileSchema != StepFileSchema) {
        DeadlyImportError("Unrecognized file schema: " + head.fileSchema);
    }
}